

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpretedLiteralEvaluator.cpp
# Opt level: O2

bool __thiscall
Kernel::InterpretedLiteralEvaluator::RatEvaluator::tryEvaluateUnaryFunc
          (RatEvaluator *this,Interpretation op,Value *arg,Value *res)

{
  IntegerConstantType *this_00;
  double in_XMM0_Qa;
  RationalConstantType local_60;
  undefined1 local_40 [32];
  IntegerConstantType local_20;
  
  if (op == RAT_TRUNCATE) {
    RationalConstantType::truncate((RationalConstantType *)local_40,(char *)arg,(__off_t)arg);
    RationalConstantType::RationalConstantType(&local_60,(IntegerConstantType *)local_40);
    RationalConstantType::operator=(res,&local_60);
    RationalConstantType::~RationalConstantType(&local_60);
    this_00 = (IntegerConstantType *)local_40;
  }
  else if (op == RAT_FLOOR) {
    RationalConstantType::floor((RationalConstantType *)&local_20,in_XMM0_Qa);
    RationalConstantType::RationalConstantType(&local_60,&local_20);
    RationalConstantType::operator=(res,&local_60);
    RationalConstantType::~RationalConstantType(&local_60);
    this_00 = &local_20;
  }
  else {
    if (op != RAT_CEILING) {
      if (op == RAT_UNARY_MINUS) {
        RationalConstantType::operator-(&local_60,arg);
        RationalConstantType::operator=(res,&local_60);
        RationalConstantType::~RationalConstantType(&local_60);
        return true;
      }
      return false;
    }
    RationalConstantType::ceiling((RationalConstantType *)(local_40 + 0x10));
    RationalConstantType::RationalConstantType(&local_60,(IntegerConstantType *)(local_40 + 0x10));
    RationalConstantType::operator=(res,&local_60);
    RationalConstantType::~RationalConstantType(&local_60);
    this_00 = (IntegerConstantType *)(local_40 + 0x10);
  }
  IntegerConstantType::~IntegerConstantType(this_00);
  return true;
}

Assistant:

virtual bool tryEvaluateUnaryFunc(Interpretation op, const Value& arg, Value& res)
  {
    switch(op) {
    case Theory::RAT_UNARY_MINUS:
      res = -arg;
      return true;
    case Theory::RAT_FLOOR:
      res = RationalConstantType(arg.floor());
      return true;
    case Theory::RAT_CEILING:
      res = RationalConstantType(arg.ceiling());
      return true;
    case Theory::RAT_TRUNCATE:
      res = RationalConstantType(arg.truncate());
      return true;
    default:
      return false;
    }
  }